

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
InternalFixupMembersImport_OffsetErrors_Test::~InternalFixupMembersImport_OffsetErrors_Test
          (InternalFixupMembersImport_OffsetErrors_Test *this)

{
  InternalFixupMembersImport_OffsetErrors_Test *this_local;
  
  ~InternalFixupMembersImport_OffsetErrors_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (InternalFixupMembersImport, OffsetErrors) {
    // The offset key is missing altogether.
    {
        auto const & parser1 = this->parse (R"({ "section":"text", "type":17, "addend":23 })");
        EXPECT_TRUE (parser1.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (
            parser1.last_error (),
            make_error_code (pstore::exchange::import_ns::error::ifixup_object_was_incomplete));
    }
    // The offset key has the wrong type.
    {
        auto const & parser2 =
            this->parse (R"({ "section":"text", "type":17, "offset":true, "addend":23 })");
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
    // Offset is negative.
    {
        auto const & parser3 =
            this->parse (R"({ "section":"text", "type":17, "offset":-3, "addend":23 })");
        EXPECT_TRUE (parser3.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser3.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_number));
    }
}